

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::netif::getInterfaceAddresses_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,netif *this,int family)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  long lVar3;
  size_t sVar4;
  undefined4 in_register_00000014;
  long *plVar5;
  string ipAddr;
  IF_ADDRS allAddrs;
  value_type local_90;
  long *local_70;
  char local_68 [56];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = (long *)0x0;
  getifaddrs(&local_70,this,CONCAT44(in_register_00000014,family));
  if (local_70 == (long *)0x0) {
    return __return_storage_ptr__;
  }
  paVar1 = &local_90.field_2;
  plVar5 = local_70;
  do {
    uVar2 = *(ushort *)plVar5[3];
    if (uVar2 == 2) {
      lVar3 = 4;
LAB_003c4ac5:
      inet_ntop((uint)uVar2,(void *)(plVar5[3] + lVar3),local_68,0x2e);
      local_90._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(local_68);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,local_68,local_68 + sVar4)
      ;
      if (local_90._M_string_length != 0) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)__return_storage_ptr__,&local_90);
      }
    }
    else {
      if (uVar2 == 10) {
        lVar3 = 8;
        goto LAB_003c4ac5;
      }
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    do {
      do {
        plVar5 = (long *)*plVar5;
        if (plVar5 == (long *)0x0) {
          if (local_70 == (long *)0x0) {
            return __return_storage_ptr__;
          }
          freeifaddrs();
          return __return_storage_ptr__;
        }
      } while ((ushort *)plVar5[3] == (ushort *)0x0);
      uVar2 = *(ushort *)plVar5[3];
    } while (((uVar2 & 0xfff7) != 2) ||
            (((uint)this & 0xfffffff7) == 2 && (uint)uVar2 != (uint)this));
  } while( true );
}

Assistant:

std::vector<std::string> getInterfaceAddresses(int family)
    {
        std::vector<std::string> result_list;

        IF_ADDRS allAddrs = NULL;

        getAddresses(family, &allAddrs);

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        WSADATA wsaData;
        if (WSAStartup(0x202, &wsaData) != 0) {
            return result_list;
        }
        auto winAddrs = allAddrs;
        while (winAddrs) {
            auto addrs = winAddrs->FirstUnicastAddress;
#else
        auto addrs = allAddrs;
#endif

            for (auto a = addrs; a != NULL; a = getNextAddress(family, a)) {
                std::string ipAddr = addressToString(getSockAddr(a), getSockAddrLen(a));
                if (!ipAddr.empty()) {
                    result_list.push_back(ipAddr);
                }
            }

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
            winAddrs = winAddrs->Next;
        }
        WSACleanup();
#endif

        if (allAddrs) {
            freeAddresses(allAddrs);
        }
        return result_list;
    }